

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O3

void __thiscall
bssl::MRUQueue<bssl::DTLSRecordNumber,_32UL>::PushBack
          (MRUQueue<bssl::DTLSRecordNumber,_32UL> *this,DTLSRecordNumber t)

{
  byte bVar1;
  DTLSRecordNumber *pDVar2;
  
  bVar1 = (this->storage_).size_;
  if ((ulong)bVar1 < 0x20) {
    if (this->start_ != '\0') {
      __assert_fail("start_ == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/internal.h"
                    ,100,
                    "void bssl::MRUQueue<bssl::DTLSRecordNumber, 32>::PushBack(T) [T = bssl::DTLSRecordNumber, N = 32]"
                   );
    }
    *(uint64_t *)((this->storage_).storage_ + (ulong)bVar1 * 8) = t.combined_;
    (this->storage_).size_ = bVar1 + 1;
  }
  else {
    pDVar2 = operator[](this,0);
    pDVar2->combined_ = t.combined_;
    this->start_ = this->start_ + 1 & 0x1f;
  }
  return;
}

Assistant:

void PushBack(T t) {
    if (storage_.size() < N) {
      assert(start_ == 0);
      storage_.PushBack(std::move(t));
    } else {
      (*this)[0] = std::move(t);
      start_ = (start_ + 1) % N;
    }
  }